

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v7::detail::
     handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>&>
               (char spec,
               int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 < 0x62) {
    if (iVar1 < 0x4c) {
      if (iVar1 == 0) {
LAB_0011ddaf:
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_dec(handler)
        ;
        return;
      }
      if (iVar1 == 0x42) goto LAB_0011dda7;
    }
    else {
      if (iVar1 == 0x4c) {
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num(handler)
        ;
        return;
      }
      if (iVar1 == 0x58) goto LAB_0011dd8d;
    }
  }
  else if (iVar1 < 100) {
    if (iVar1 == 0x62) {
LAB_0011dda7:
      int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_bin(handler);
      return;
    }
    if (iVar1 == 99) {
      int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_chr(handler);
      return;
    }
  }
  else {
    if (iVar1 == 0x78) {
LAB_0011dd8d:
      int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_hex(handler);
      return;
    }
    if (iVar1 == 0x6f) {
      int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_oct(handler);
      return;
    }
    if (iVar1 == 100) goto LAB_0011ddaf;
  }
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_error(handler);
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
#ifdef FMT_DEPRECATED_N_SPECIFIER
  case 'n':
#endif
  case 'L':
    handler.on_num();
    break;
  case 'c':
    handler.on_chr();
    break;
  default:
    handler.on_error();
  }
}